

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

hugeint_t duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>::
          Operation<bool,duckdb::hugeint_t>(bool input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  hugeint_t hVar2;
  hugeint_t result_value;
  allocator local_51;
  hugeint_t local_50;
  string local_40;
  
  bVar1 = TryCastToDecimal::Operation<bool,duckdb::hugeint_t>
                    (input,&local_50,*(CastParameters **)((long)dataptr + 8),
                     *(uint8_t *)((long)dataptr + 0x18),*(uint8_t *)((long)dataptr + 0x19));
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,"Failed to cast decimal value",&local_51);
    hVar2 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                      (&local_40,mask,idx,(VectorTryCastData *)dataptr);
    ::std::__cxx11::string::~string((string *)&local_40);
    local_50 = hVar2;
  }
  return local_50;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}